

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

void lest::inform(location *where,text *expr)

{
  undefined8 uVar1;
  char unaff_BPL;
  void *unaff_R12;
  void *unaff_R13;
  void *local_140;
  long local_130;
  void *local_120;
  long local_110;
  location *local_b0;
  long local_a0;
  long *local_50;
  long local_40 [2];
  
  uVar1 = __cxa_rethrow();
  if (local_140 != unaff_R12) {
    operator_delete(local_140,local_130 + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_b0 != where) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_120 != unaff_R13) {
    operator_delete(local_120,local_110 + 1);
  }
  if (unaff_BPL != '\0') {
    __cxa_free_exception();
  }
  __cxa_end_catch();
  _Unwind_Resume(uVar1);
}

Assistant:

inline void inform( location where, text expr )
{
    try
    {
        throw;
    }
    catch( failure const & )
    {
        throw;
    }
    catch( std::exception const & e )
    {
        throw unexpected( where, expr, with_message( e.what() ) ); \
    }
    catch(...)
    {
        throw unexpected( where, expr, "of unknown type" ); \
    }
}